

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::StartArray(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *this)

{
  char *pcVar1;
  
  pcVar1 = (this->stack_).stackTop_;
  if ((long)(this->stack_).stackEnd_ - (long)pcVar1 < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    pcVar1 = (this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = pcVar1 + 0x10;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0xe] = '\x04';
  pcVar1[0xf] = '\0';
  return true;
}

Assistant:

bool StartArray() { new (stack_.template Push<ValueType>()) ValueType(kArrayType); return true; }